

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::clear(hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
        *this)

{
  bool bVar1;
  hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  *this_local;
  
  bVar1 = vector<crnlib::hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
          ::empty(&this->m_values);
  if (!bVar1) {
    vector<crnlib::hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
    ::clear_no_destruction(&this->m_values);
    this->m_hash_shift = 0x20;
    this->m_num_valid = 0;
    this->m_grow_threshold = 0;
  }
  return;
}

Assistant:

inline void clear()
        {
            if (!m_values.empty())
            {
                if (CRNLIB_HAS_DESTRUCTOR(Key) || CRNLIB_HAS_DESTRUCTOR(Value))
                {
                    node* p = &get_node(0);
                    node* p_end = p + m_values.size();

                    uint num_remaining = m_num_valid;
                    while (p != p_end)
                    {
                        if (p->state)
                        {
                            destruct_value_type(p);
                            num_remaining--;
                            if (!num_remaining)
                            {
                                break;
                            }
                        }

                        p++;
                    }
                }

                m_values.clear_no_destruction();

                m_hash_shift = 32;
                m_num_valid = 0;
                m_grow_threshold = 0;
            }
        }